

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

GUID * FBaseCVar::ToGUID(UCVarValue value,ECVarType type)

{
  UCVarValue UVar1;
  
  if (type != CVAR_GUID) {
    if (type == CVAR_String) {
      UVar1 = FromString(value.String,CVAR_GUID);
      return (GUID *)UVar1.String;
    }
    value.String = (char *)0x0;
  }
  return (GUID *)value.String;
}

Assistant:

const GUID *FBaseCVar::ToGUID (UCVarValue value, ECVarType type)
{
	UCVarValue trans;

	switch (type)
	{
	case CVAR_String:
		trans = FromString (value.String, CVAR_GUID);
		return trans.pGUID;

	case CVAR_GUID:
		return value.pGUID;

	default:
		return NULL;
	}
}